

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall nivalis::ParseSession::end_thunk(ParseSession *this)

{
  pointer *ppuVar1;
  _OpCode local_14;
  unsigned_long local_10;
  
  local_14 = thunk_jmp;
  local_10 = ((long)(this->result).ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->result).ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) -
             (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
  std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
  emplace_back<nivalis::OpCode::_OpCode,unsigned_long>
            ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)&this->result,
             &local_14,&local_10);
  ppuVar1 = &(this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void end_thunk() {
        result.ast.emplace_back(OpCode::thunk_jmp,
                    result.ast.size() - thunks.back());
        thunks.pop_back();
    }